

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBeam.h
# Opt level: O0

void __thiscall
chrono::fea::ChLoaderBeamWrenchDistributed::ChLoaderBeamWrenchDistributed
          (ChLoaderBeamWrenchDistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  shared_ptr<chrono::ChLoadableU> local_28;
  shared_ptr<chrono::ChLoadableU> *local_18;
  shared_ptr<chrono::ChLoadableU> *mloadable_local;
  ChLoaderBeamWrenchDistributed *this_local;
  
  local_18 = mloadable;
  mloadable_local = (shared_ptr<chrono::ChLoadableU> *)this;
  std::shared_ptr<chrono::ChLoadableU>::shared_ptr(&local_28,mloadable);
  ChLoaderUdistributed::ChLoaderUdistributed(&this->super_ChLoaderUdistributed,&local_28);
  std::shared_ptr<chrono::ChLoadableU>::~shared_ptr(&local_28);
  (this->super_ChLoaderUdistributed).super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderBeamWrenchDistributed_001c3dd8;
  ChVector<double>::ChVector(&this->torqueperunit);
  ChVector<double>::ChVector(&this->forceperunit);
  ChVector<double>::operator=(&this->torqueperunit,(ChVector<double> *)&VNULL);
  ChVector<double>::operator=(&this->forceperunit,(ChVector<double> *)&VNULL);
  return;
}

Assistant:

ChLoaderBeamWrenchDistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderUdistributed(mloadable) {
        this->torqueperunit = VNULL;
        this->forceperunit = VNULL;
    }